

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
WrappedBytes::hibernate<hiberlite::AVisitor<hiberlite::UpdateBean>>
          (WrappedBytes *this,AVisitor<hiberlite::UpdateBean> *ar)

{
  string local_a8;
  string local_88;
  sql_nvp<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_68;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"bytes","");
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
  hiberlite::sql_nvp<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::sql_nvp
            (&local_68,&local_88,&this->bytes,&local_a8);
  hiberlite::AVisitor<hiberlite::UpdateBean>::operator&(ar,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.search_key._M_dataplus._M_p != &local_68.search_key.field_2) {
    operator_delete(local_68.search_key._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != &local_68.name.field_2) {
    operator_delete(local_68.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return;
}

Assistant:

void hibernate(Archive & ar)
	{
  	  ar & HIBERLITE_NVP(bytes);
	}